

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::StreamingBufferSizeSetting::SetLocal(ClientContext *context,Value *input)

{
  ClientConfig *pCVar1;
  idx_t iVar2;
  string local_38;
  
  pCVar1 = ClientConfig::GetConfig(context);
  Value::ToString_abi_cxx11_(&local_38,input);
  iVar2 = DBConfig::ParseMemoryLimit(&local_38);
  pCVar1->streaming_buffer_size = iVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void StreamingBufferSizeSetting::SetLocal(ClientContext &context, const Value &input) {
	auto &config = ClientConfig::GetConfig(context);
	config.streaming_buffer_size = DBConfig::ParseMemoryLimit(input.ToString());
}